

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_SetVisibleRotation
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  AActor *pAVar2;
  bool bVar3;
  bool local_7b;
  int u_1;
  int u;
  AActor *mobj;
  int ptr;
  int flags;
  DAngle pitchend;
  DAngle pitchstart;
  DAngle angleend;
  DAngle anglestart;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1a76,
                  "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    pAVar2 = (AActor *)(param->field_0).field_1.a;
    local_7b = true;
    if (pAVar2 != (AActor *)0x0) {
      local_7b = DObject::IsKindOf((DObject *)pAVar2,AActor::RegistrationInfo.MyClass);
    }
    if (local_7b != false) {
      TAngle<double>::TAngle(&angleend);
      if (numparam < 2) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a77,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        TAngle<double>::operator=(&angleend,(pVVar1->field_0).f);
      }
      else {
        if (param[1].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a77,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        TAngle<double>::operator=(&angleend,param[1].field_0.f);
      }
      TAngle<double>::TAngle(&pitchstart);
      if (numparam < 3) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a78,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        TAngle<double>::operator=(&pitchstart,(pVVar1->field_0).f);
      }
      else {
        if (param[2].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a78,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        TAngle<double>::operator=(&pitchstart,param[2].field_0.f);
      }
      TAngle<double>::TAngle(&pitchend);
      if (numparam < 4) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a79,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        TAngle<double>::operator=(&pitchend,(pVVar1->field_0).f);
      }
      else {
        if (param[3].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a79,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        TAngle<double>::operator=(&pitchend,param[3].field_0.f);
      }
      TAngle<double>::TAngle((TAngle<double> *)&ptr);
      if (numparam < 5) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a7a,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
        TAngle<double>::operator=((TAngle<double> *)&ptr,(pVVar1->field_0).f);
      }
      else {
        if (param[4].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a7a,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        TAngle<double>::operator=((TAngle<double> *)&ptr,param[4].field_0.f);
      }
      if (numparam < 6) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
        if ((pVVar1->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a7b,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
        mobj._4_4_ = (pVVar1->field_0).i;
      }
      else {
        if (param[5].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a7b,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        mobj._4_4_ = param[5].field_0.i;
      }
      if (numparam < 7) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
        if ((pVVar1->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a7c,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
        mobj._0_4_ = (pVVar1->field_0).i;
      }
      else {
        if (param[6].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1a7c,
                        "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        mobj._0_4_ = param[6].field_0.i;
      }
      pAVar2 = COPY_AAPTR(pAVar2,(int)mobj);
      if (pAVar2 == (AActor *)0x0) {
        if (numret < 1) {
          param_local._4_4_ = 0;
        }
        else {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1a82,
                          "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          VMReturn::SetInt(ret,0);
          param_local._4_4_ = 1;
        }
      }
      else {
        if ((mobj._4_4_ & 1) == 0) {
          TAngle<double>::operator=(&pAVar2->VisibleStartAngle,&angleend);
        }
        if ((mobj._4_4_ & 2) == 0) {
          TAngle<double>::operator=(&pAVar2->VisibleEndAngle,&pitchstart);
        }
        if ((mobj._4_4_ & 4) == 0) {
          TAngle<double>::operator=(&pAVar2->VisibleStartPitch,&pitchend);
        }
        if ((mobj._4_4_ & 8) == 0) {
          TAngle<double>::operator=(&pAVar2->VisibleEndPitch,(TAngle<double> *)&ptr);
        }
        if (numret < 1) {
          param_local._4_4_ = 0;
        }
        else {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1a96,
                          "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          VMReturn::SetInt(ret,1);
          param_local._4_4_ = 1;
        }
      }
      return param_local._4_4_;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1a76,
                  "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1a76,
                "int AF_AActor_A_SetVisibleRotation(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetVisibleRotation)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE_DEF(anglestart)
	PARAM_ANGLE_DEF(angleend)	
	PARAM_ANGLE_DEF(pitchstart)
	PARAM_ANGLE_DEF(pitchend)	
	PARAM_INT_DEF(flags)		
	PARAM_INT_DEF(ptr)			

	AActor *mobj = COPY_AAPTR(self, ptr);

	if (mobj == nullptr)
	{
		ACTION_RETURN_BOOL(false);
	}
		
	if (!(flags & VRF_NOANGLESTART))
	{
		mobj->VisibleStartAngle = anglestart;
	}
	if (!(flags & VRF_NOANGLEEND))
	{
		mobj->VisibleEndAngle = angleend;
	}
	if (!(flags & VRF_NOPITCHSTART))
	{
		mobj->VisibleStartPitch = pitchstart;
	}
	if (!(flags & VRF_NOPITCHEND))
	{
		mobj->VisibleEndPitch = pitchend;
	}

	ACTION_RETURN_BOOL(true);
}